

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

Gia_ManTer_t * Gia_ManTerCreate(Gia_Man_t *pAig)

{
  int iVar1;
  Gia_ManTer_t *pGVar2;
  Gia_Man_t *pGVar3;
  uint *puVar4;
  Vec_Ptr_t *pVVar5;
  int *piVar6;
  uint **ppuVar7;
  Vec_Int_t *pVVar8;
  char *pcVar9;
  Gia_ManTer_t *p;
  Gia_Man_t *pAig_local;
  
  pGVar2 = (Gia_ManTer_t *)calloc(1,0x68);
  pGVar3 = Gia_ManFront(pAig);
  pGVar2->pAig = pGVar3;
  pGVar2->nIters = 300;
  iVar1 = Abc_BitWordNum(pGVar2->pAig->nFront << 1);
  puVar4 = (uint *)malloc((long)iVar1 << 2);
  pGVar2->pDataSim = puVar4;
  iVar1 = Gia_ManCiNum(pGVar2->pAig);
  iVar1 = Abc_BitWordNum(iVar1 << 1);
  puVar4 = (uint *)malloc((long)iVar1 << 2);
  pGVar2->pDataSimCis = puVar4;
  iVar1 = Gia_ManCoNum(pGVar2->pAig);
  iVar1 = Abc_BitWordNum(iVar1 << 1);
  puVar4 = (uint *)malloc((long)iVar1 << 2);
  pGVar2->pDataSimCos = puVar4;
  iVar1 = Gia_ManRegNum(pAig);
  iVar1 = Abc_BitWordNum(iVar1 << 1);
  pGVar2->nStateWords = iVar1;
  pVVar5 = Vec_PtrAlloc(1000);
  pGVar2->vStates = pVVar5;
  iVar1 = Gia_ManRegNum(pAig);
  piVar6 = (int *)calloc((long)iVar1,4);
  pGVar2->pCount0 = piVar6;
  iVar1 = Gia_ManRegNum(pAig);
  piVar6 = (int *)calloc((long)iVar1,4);
  pGVar2->pCountX = piVar6;
  iVar1 = Abc_PrimeCudd(500);
  pGVar2->nBins = iVar1;
  ppuVar7 = (uint **)calloc((long)pGVar2->nBins,8);
  pGVar2->pBins = ppuVar7;
  pVVar8 = Vec_IntAlloc(100);
  pGVar2->vRetired = pVVar8;
  iVar1 = Gia_ManRegNum(pAig);
  pcVar9 = (char *)calloc((long)iVar1,1);
  pGVar2->pRetired = pcVar9;
  return pGVar2;
}

Assistant:

Gia_ManTer_t * Gia_ManTerCreate( Gia_Man_t * pAig )
{
    Gia_ManTer_t * p;
    p = ABC_CALLOC( Gia_ManTer_t, 1 );
    p->pAig   = Gia_ManFront( pAig );
    p->nIters = 300;
    p->pDataSim    = ABC_ALLOC( unsigned, Abc_BitWordNum(2*p->pAig->nFront) );
    p->pDataSimCis = ABC_ALLOC( unsigned, Abc_BitWordNum(2*Gia_ManCiNum(p->pAig)) );
    p->pDataSimCos = ABC_ALLOC( unsigned, Abc_BitWordNum(2*Gia_ManCoNum(p->pAig)) );
    // allocate storage for terminary states
    p->nStateWords = Abc_BitWordNum( 2*Gia_ManRegNum(pAig) );
    p->vStates  = Vec_PtrAlloc( 1000 );
    p->pCount0  = ABC_CALLOC( int, Gia_ManRegNum(pAig) );
    p->pCountX  = ABC_CALLOC( int, Gia_ManRegNum(pAig) );
    p->nBins    = Abc_PrimeCudd( 500 );
    p->pBins    = ABC_CALLOC( unsigned *, p->nBins );
    p->vRetired = Vec_IntAlloc( 100 );
    p->pRetired = ABC_CALLOC( char, Gia_ManRegNum(pAig) );
    return p;
}